

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall helics::TimeCoordinator::updateNextPossibleEventTime(TimeCoordinator *this)

{
  bool bVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  TimeRepresentation<count_time<9,_long>_> *pTVar3;
  Time TVar4;
  long in_RDI;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  byte bVar5;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffff68;
  byte local_89;
  TimeCoordinator *in_stack_ffffffffffffff98;
  TimeRepresentation<count_time<9,_long>_> local_60;
  TimeRepresentation<count_time<9,_long>_> local_58;
  TimeCoordinator *in_stack_ffffffffffffffb0;
  Time in_stack_ffffffffffffffb8;
  TimeRepresentation<count_time<9,_long>_> local_38;
  TimeRepresentation<count_time<9,_long>_> local_30;
  undefined8 local_28;
  baseType local_20;
  baseType local_10;
  
  if (*(char *)(in_RDI + 0x259) == '\0') {
    local_10 = (baseType)getNextPossibleTime(in_stack_ffffffffffffff98);
  }
  else {
    local_10 = *(baseType *)(in_RDI + 0x130);
  }
  *(baseType *)(in_RDI + 0x140) = local_10;
  if ((*(byte *)(in_RDI + 0x251) & 1) == 0) {
    pTVar3 = (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x148);
    local_58 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(pTVar3,&local_58);
    bVar5 = 0;
    if (bVar1) {
      bVar5 = *(byte *)(in_RDI + 0x252) ^ 0xff;
    }
    if ((bVar5 & 1) != 0) {
      local_60 = TimeRepresentation<count_time<9,_long>_>::operator+
                           (in_stack_ffffffffffffff68,
                            (TimeRepresentation<count_time<9,_long>_> *)
                            CONCAT17(bVar5,in_stack_ffffffffffffff60));
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                        (&local_60,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x140));
      if (bVar1) {
        TVar2 = TimeRepresentation<count_time<9,_long>_>::operator+
                          (in_stack_ffffffffffffff68,
                           (TimeRepresentation<count_time<9,_long>_> *)
                           CONCAT17(bVar5,in_stack_ffffffffffffff60));
        *(baseType *)(in_RDI + 0x140) = TVar2.internalTimeCode;
        TVar4 = generateAllowedTime(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
        *(baseType *)(in_RDI + 0x140) = TVar4.internalTimeCode;
      }
    }
    std::min<TimeRepresentation<count_time<9,long>>>
              (pTVar3,(TimeRepresentation<count_time<9,_long>_> *)0x6171f5);
    TVar2 = TimeRepresentation<count_time<9,_long>_>::operator+
                      (in_stack_ffffffffffffff68,
                       (TimeRepresentation<count_time<9,_long>_> *)
                       CONCAT17(bVar5,in_stack_ffffffffffffff60));
    *(baseType *)(in_RDI + 0x140) = TVar2.internalTimeCode;
  }
  else if (*(char *)(in_RDI + 0x259) == '\0') {
    local_28 = *(undefined8 *)(in_RDI + 0x138);
    local_20 = (baseType)generateAllowedTime(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
    TVar2 = TimeRepresentation<count_time<9,_long>_>::operator+
                      (in_stack_ffffffffffffff68,
                       (TimeRepresentation<count_time<9,_long>_> *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    *(baseType *)(in_RDI + 0x140) = TVar2.internalTimeCode;
  }
  else {
    pTVar3 = (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x148);
    local_30 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(pTVar3,&local_30);
    local_89 = 0;
    if (bVar1) {
      local_89 = *(byte *)(in_RDI + 0x252) ^ 0xff;
    }
    if ((local_89 & 1) != 0) {
      local_38 = TimeRepresentation<count_time<9,_long>_>::operator+
                           (pTVar3,(TimeRepresentation<count_time<9,_long>_> *)
                                   CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                        (&local_38,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x140));
      if (bVar1) {
        TVar4 = generateAllowedTime(in_stack_ffffffffffffffb0,*(baseType *)(in_RDI + 0x138));
        *(baseType *)(in_RDI + 0x140) = TVar4.internalTimeCode;
      }
    }
    std::min<TimeRepresentation<count_time<9,long>>>
              (in_stack_ffffffffffffff58,(TimeRepresentation<count_time<9,_long>_> *)0x6170aa);
    TVar2 = TimeRepresentation<count_time<9,_long>_>::operator+
                      (pTVar3,(TimeRepresentation<count_time<9,_long>_> *)
                              CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    *(baseType *)(in_RDI + 0x140) = TVar2.internalTimeCode;
  }
  return;
}

Assistant:

void TimeCoordinator::updateNextPossibleEventTime()
{
    time_next =
        (iterating == IterationRequest::NO_ITERATIONS) ? getNextPossibleTime() : time_granted;

    if (info.uninterruptible) {
        if (iterating == IterationRequest::NO_ITERATIONS) {
            time_next = generateAllowedTime(time_requested) + info.outputDelay;
        } else {
            if (time_minminDe < Time::maxVal() && !info.restrictive_time_policy) {
                if (time_minminDe + info.inputDelay > time_next) {
                    time_next = generateAllowedTime(time_requested);
                }
            }
            time_next = std::min(time_next, time_exec) + info.outputDelay;
        }
    } else {
        if (time_minminDe < Time::maxVal() && !info.restrictive_time_policy) {
            if (time_minminDe + info.inputDelay > time_next) {
                time_next = time_minminDe + info.inputDelay;
                time_next = generateAllowedTime(time_next);
            }
        }
        time_next = std::min(time_next, time_exec) + info.outputDelay;
    }
}